

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall flatbuffers::cpp::CppGenerator::GenFlatbuffersVersionCheck(CppGenerator *this)

{
  CodeWriter *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "// Ensure the included flatbuffers.h is the same version as when this file was",
             (allocator<char> *)&local_110);
  this_00 = &this->code_;
  CodeWriter::operator+=(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"// generated, otherwise it may not be compatible.",
             (allocator<char> *)&local_110);
  CodeWriter::operator+=(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::to_string(&local_f0,0x19);
  std::operator+(&local_110,"static_assert(FLATBUFFERS_VERSION_MAJOR == ",&local_f0);
  std::operator+(&local_70,&local_110," &&");
  CodeWriter::operator+=(this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,2);
  std::operator+(&local_110,"              FLATBUFFERS_VERSION_MINOR == ",&local_f0);
  std::operator+(&local_90,&local_110," &&");
  CodeWriter::operator+=(this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,10);
  std::operator+(&local_110,"              FLATBUFFERS_VERSION_REVISION == ",&local_f0);
  std::operator+(&local_b0,&local_110,",");
  CodeWriter::operator+=(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"             \"Non-compatible flatbuffers version included\");",
             (allocator<char> *)&local_110);
  CodeWriter::operator+=(this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void GenFlatbuffersVersionCheck() {
    code_ +=
        "// Ensure the included flatbuffers.h is the same version as when this "
        "file was";
    code_ += "// generated, otherwise it may not be compatible.";
    code_ += "static_assert(FLATBUFFERS_VERSION_MAJOR == " +
             std::to_string(FLATBUFFERS_VERSION_MAJOR) + " &&";
    code_ += "              FLATBUFFERS_VERSION_MINOR == " +
             std::to_string(FLATBUFFERS_VERSION_MINOR) + " &&";
    code_ += "              FLATBUFFERS_VERSION_REVISION == " +
             std::to_string(FLATBUFFERS_VERSION_REVISION) + ",";
    code_ += "             \"Non-compatible flatbuffers version included\");";
  }